

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContactAngle2.cpp
# Opt level: O3

void __thiscall
OpenMD::ContactAngle2::ContactAngle2
          (ContactAngle2 *this,SimInfo *info,string *filename,string *sele1,string *sele2,
          RealType solidZ,RealType centroidX,RealType centroidY,RealType threshDens,
          RealType bufferLength,int nrbins,int nzbins)

{
  long *plVar1;
  ostream *poVar2;
  long *plVar3;
  stringstream params;
  string local_1f0;
  RealType local_1d0;
  RealType local_1c8;
  RealType local_1c0;
  RealType local_1b8;
  RealType local_1b0;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  ios_base local_128 [264];
  
  local_1d0 = solidZ;
  local_1c8 = centroidX;
  local_1c0 = centroidY;
  local_1b8 = threshDens;
  local_1b0 = bufferLength;
  SequentialAnalyzer::SequentialAnalyzer(&this->super_SequentialAnalyzer,info,filename,sele1,sele2);
  (this->super_SequentialAnalyzer)._vptr_SequentialAnalyzer =
       (_func_int **)&PTR__SequentialAnalyzer_0024d9d0;
  this->solidZ_ = local_1d0;
  this->centroidX_ = local_1c8;
  this->centroidY_ = local_1c0;
  this->threshDens_ = local_1b8;
  this->bufferLength_ = local_1b0;
  this->nRBins_ = (long)nrbins;
  this->nZBins_ = (long)nzbins;
  getPrefix(&local_1f0,filename);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_1f0);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_198 = *plVar3;
    lStack_190 = plVar1[3];
    local_1a8 = &local_198;
  }
  else {
    local_198 = *plVar3;
    local_1a8 = (long *)*plVar1;
  }
  local_1a0 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::_M_assign((string *)&(this->super_SequentialAnalyzer).outputFilename_);
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,local_198 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198," referenceZ = ",0xe);
  poVar2 = std::ostream::_M_insert<double>(this->solidZ_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", centroid = (",0xe);
  poVar2 = std::ostream::_M_insert<double>(this->centroidX_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>(this->centroidY_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", threshDens = ",0xf);
  poVar2 = std::ostream::_M_insert<double>(this->threshDens_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", bufferLength = ",0x11);
  poVar2 = std::ostream::_M_insert<double>(this->bufferLength_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", nbins = ",10);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", nbins_z = ",0xc);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&(this->super_SequentialAnalyzer).paramString_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a8);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

ContactAngle2::ContactAngle2(SimInfo* info, const std::string& filename,
                               const std::string& sele1,
                               const std::string& sele2, RealType solidZ,
                               RealType centroidX, RealType centroidY,
                               RealType threshDens, RealType bufferLength,
                               int nrbins, int nzbins) :
      SequentialAnalyzer(info, filename, sele1, sele2),
      solidZ_(solidZ), centroidX_(centroidX), centroidY_(centroidY),
      threshDens_(threshDens), bufferLength_(bufferLength), nRBins_(nrbins),
      nZBins_(nzbins) {
    setOutputName(getPrefix(filename) + ".ca2");

    std::stringstream params;
    params << " referenceZ = " << solidZ_ << ", centroid = (" << centroidX_
           << ", " << centroidY_ << ")"
           << ", threshDens = " << threshDens_
           << ", bufferLength = " << bufferLength_ << ", nbins = " << nRBins_
           << ", nbins_z = " << nZBins_;

    const std::string paramString = params.str();
    setParameterString(paramString);
  }